

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O1

int __thiscall Omega_h::filesystem::IteratorImpl::close(IteratorImpl *this,int __fd)

{
  DIR *__dirp;
  int in_EAX;
  int *piVar1;
  filesystem_error *this_00;
  
  __dirp = (DIR *)this->stream;
  if (__dirp != (DIR *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    in_EAX = closedir(__dirp);
    this->stream = (DIR *)0x0;
    if (in_EAX != 0) {
      this_00 = (filesystem_error *)__cxa_allocate_exception(0x20);
      filesystem_error::filesystem_error(this_00,*piVar1,"directory_iterator");
      __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
  }
  return in_EAX;
}

Assistant:

void close() {
    if (stream == nullptr) return;
    errno = 0;
    int err = ::closedir(stream);
    stream = nullptr;
    if (err != 0) {
      throw filesystem_error(errno, "directory_iterator");
    }
  }